

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_ems_parse_clienthello(SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  uint16_t uVar1;
  size_t sVar2;
  CBS *contents_local;
  uint8_t *out_alert_local;
  SSL_HANDSHAKE *hs_local;
  
  uVar1 = ssl_protocol_version(hs->ssl);
  if (uVar1 < 0x304) {
    if (contents == (CBS *)0x0) {
      hs_local._7_1_ = true;
    }
    else {
      sVar2 = CBS_len(contents);
      if (sVar2 == 0) {
        *(uint *)&hs->field_0x6c8 = *(uint *)&hs->field_0x6c8 & 0xfffdffff | 0x20000;
        hs_local._7_1_ = true;
      }
      else {
        hs_local._7_1_ = false;
      }
    }
  }
  else {
    hs_local._7_1_ = true;
  }
  return hs_local._7_1_;
}

Assistant:

static bool ext_ems_parse_clienthello(SSL_HANDSHAKE *hs, uint8_t *out_alert,
                                      CBS *contents) {
  if (ssl_protocol_version(hs->ssl) >= TLS1_3_VERSION) {
    return true;
  }

  if (contents == NULL) {
    return true;
  }

  if (CBS_len(contents) != 0) {
    return false;
  }

  hs->extended_master_secret = true;
  return true;
}